

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  uchar *__ptr;
  long lVar4;
  int iVar5;
  ulong uVar6;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  float *pfVar10;
  uchar *puVar11;
  uint uVar12;
  long lVar13;
  float fVar14;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    __ptr = stbi__load_flip(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar2 = *y * *x;
      pfVar3 = (float *)malloc((long)(int)(req_comp * uVar2) << 2);
      if (pfVar3 != (float *)0x0) {
        if (0 < (int)uVar2) {
          uVar12 = (req_comp + (req_comp & 1U)) - 1;
          lVar4 = (long)req_comp;
          uVar6 = 0;
          pfVar7 = pfVar3;
          puVar11 = __ptr;
          do {
            uVar9 = 0;
            if (0 < (int)uVar12) {
              uVar9 = 0;
              do {
                fVar14 = powf((float)puVar11[uVar9] / 255.0,stbi__l2h_gamma);
                pfVar7[uVar9] = fVar14 * stbi__l2h_scale;
                uVar9 = uVar9 + 1;
              } while (uVar12 != uVar9);
            }
            if ((int)uVar9 < req_comp) {
              lVar13 = (long)(int)uVar9 + uVar6 * lVar4;
              pfVar3[lVar13] = (float)__ptr[lVar13] / 255.0;
            }
            uVar6 = uVar6 + 1;
            pfVar7 = pfVar7 + lVar4;
            puVar11 = puVar11 + lVar4;
          } while (uVar6 != uVar2);
        }
        free(__ptr);
        return pfVar3;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
    pfVar3 = (float *)0x0;
  }
  else {
    pfVar3 = stbi__hdr_load(s,x,y,comp,req_comp);
    if ((pfVar3 != (float *)0x0) && (stbi__vertically_flip_on_load != 0)) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar2 = *y >> 1;
      if (0 < (int)uVar2) {
        iVar1 = *x;
        lVar4 = (long)req_comp;
        iVar5 = (*y + -1) * iVar1;
        uVar6 = 0;
        pfVar7 = pfVar3;
        do {
          if (0 < iVar1) {
            pfVar8 = (float *)((long)iVar5 * lVar4 * 4 + (long)pfVar3);
            lVar13 = 0;
            pfVar10 = pfVar7;
            do {
              if (0 < req_comp) {
                uVar9 = 0;
                do {
                  fVar14 = pfVar10[uVar9];
                  pfVar10[uVar9] = pfVar8[uVar9];
                  pfVar8[uVar9] = fVar14;
                  uVar9 = uVar9 + 1;
                } while ((uint)req_comp != uVar9);
              }
              lVar13 = lVar13 + 1;
              pfVar8 = pfVar8 + lVar4;
              pfVar10 = pfVar10 + lVar4;
            } while (lVar13 != iVar1);
          }
          uVar6 = uVar6 + 1;
          iVar5 = iVar5 - iVar1;
          pfVar7 = pfVar7 + lVar4 * iVar1;
        } while (uVar6 != uVar2);
      }
    }
  }
  return pfVar3;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_flip(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}